

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveRedundantMaterials.cpp
# Opt level: O1

void __thiscall
Assimp::RemoveRedundantMatsProcess::SetupProperties(RemoveRedundantMatsProcess *this,Importer *pImp)

{
  string local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  Importer::GetPropertyString(&local_40,pImp,"PP_RRM_EXCLUDE_LIST",&local_60);
  std::__cxx11::string::_M_assign((string *)&this->mConfigFixedMaterials);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RemoveRedundantMatsProcess::SetupProperties(const Importer* pImp)
{
    // Get value of AI_CONFIG_PP_RRM_EXCLUDE_LIST
    mConfigFixedMaterials = pImp->GetPropertyString(AI_CONFIG_PP_RRM_EXCLUDE_LIST,"");
}